

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_disk_io.cpp
# Opt level: O0

void __thiscall
libtorrent::posix_disk_io::async_move_storage
          (posix_disk_io *this,storage_index_t storage,string *p,move_flags_t flags,
          function<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&)>
          *handler)

{
  io_context *ctx;
  value_type *this_00;
  pointer this_01;
  type local_f8;
  tuple<libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>&,std::__cxx11::string&>
  local_98 [16];
  pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined1 local_59;
  undefined1 auStack_58 [7];
  status_t ret;
  storage_error ec;
  posix_storage *st;
  function<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&)>
  *handler_local;
  move_flags_t flags_local;
  string *p_local;
  posix_disk_io *this_local;
  storage_index_t storage_local;
  
  this_00 = libtorrent::aux::
            container_wrapper<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>_>
            ::operator[](&this->m_torrents,
                         (strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>)
                         storage.m_val);
  this_01 = ::std::
            unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
            ::get(this_00);
  storage_error::storage_error((storage_error *)auStack_58);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>::
  bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void> *)&local_59
               );
  libtorrent::aux::posix_storage::move_storage
            (&local_88,this_01,p,flags,(storage_error *)auStack_58);
  ::std::
  tie<libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string>
            ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void> *)local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_59);
  ::std::
  tuple<libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>&,std::__cxx11::string&>
  ::operator=(local_98,&local_88);
  ::std::
  pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_88);
  ctx = this->m_ios;
  ::std::
  function<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&)>
  ::function(&local_f8.h,handler);
  local_f8.ret.m_val = (uchar)local_59;
  ::std::__cxx11::string::string((string *)&local_f8.p,(string *)p);
  local_f8.ec.ec.val_ = auStack_58._0_4_;
  local_f8.ec.ec.failed_ = auStack_58[4];
  local_f8.ec.ec._5_3_ = stack0xffffffffffffffad;
  boost::asio::
  post<boost::asio::io_context,libtorrent::posix_disk_io::async_move_storage(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string,libtorrent::move_flags_t,std::function<void(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string_const&,libtorrent::storage_error_const&)>)::_lambda()_1_>
            (ctx,&local_f8,(type *)0x0);
  async_move_storage(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string,libtorrent::move_flags_t,std::function<void(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string_const&,libtorrent::storage_error_const&)>)
  ::{lambda()#1}::~function((_lambda___1_ *)&local_f8);
  return;
}

Assistant:

void async_move_storage(storage_index_t const storage, std::string p
			, move_flags_t const flags
			, std::function<void(status_t, std::string const&, storage_error const&)> handler) override
		{
			posix_storage* st = m_torrents[storage].get();
			storage_error ec;
			status_t ret;
			std::tie(ret, p) = st->move_storage(p, flags, ec);
			post(m_ios, [=, h = std::move(handler)]{ h(ret, p, ec); });
		}